

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::Response::~Response(Response *this)

{
  if ((this->content_provider_resource_releaser_).super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    std::function<void_(bool)>::operator()
              (&this->content_provider_resource_releaser_,this->content_provider_success_);
  }
  std::_Function_base::~_Function_base
            (&(this->content_provider_resource_releaser_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->content_provider_).super__Function_base);
  std::__cxx11::string::~string((string *)&this->location);
  std::__cxx11::string::~string((string *)&this->body);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->headers)._M_t);
  std::__cxx11::string::~string((string *)&this->reason);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Response() {
    if (content_provider_resource_releaser_) {
      content_provider_resource_releaser_(content_provider_success_);
    }
  }